

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>::
find<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,unsigned_long&>
          (HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks> *this,
          ArrayPtr<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> table,
          unsigned_long *params)

{
  unsigned_long uVar1;
  uint uVar2;
  ulong uVar3;
  RawSchema *pRVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  uint hash;
  Entry *pEVar6;
  uint uVar7;
  unsigned_long *in_R8;
  uint *puVar8;
  Maybe<unsigned_long> MVar9;
  
  pEVar6 = table.ptr;
  aVar5.value = table.size_;
  if (pEVar6[1].value != (RawSchema *)0x0) {
    hash = (uint)((int)(*in_R8 >> 0x20) * 0xbfe3 + (int)*in_R8 != 0);
    uVar2 = _::chooseBucket(hash,(uint)pEVar6[1].value);
    uVar1 = pEVar6[1].key;
    uVar3 = (ulong)uVar2;
    uVar7 = *(uint *)(uVar1 + 4 + uVar3 * 8);
    aVar5 = extraout_RDX;
    if (uVar7 != 0) {
      puVar8 = (uint *)(uVar1 + uVar3 * 8);
      aVar5.value = *in_R8;
      do {
        if (((uVar7 != 1) && (*puVar8 == hash)) &&
           (*(unsigned_long *)(table.size_ + (ulong)(uVar7 - 2) * 0x10) == aVar5.value)) {
          *this = (HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>)0x1;
          *(ulong *)(this + 8) = (ulong)(uVar7 - 2);
          goto LAB_001a0481;
        }
        pRVar4 = (RawSchema *)(uVar3 + 1);
        uVar3 = (ulong)pRVar4 & 0xffffffff;
        if (pRVar4 == pEVar6[1].value) {
          uVar3 = 0;
        }
        puVar8 = (uint *)(uVar1 + uVar3 * 8);
        uVar7 = puVar8[1];
      } while (uVar7 != 0);
    }
  }
  *this = (HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>)0x0;
LAB_001a0481:
  MVar9.ptr.field_1.value = aVar5.value;
  MVar9.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar9.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }